

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetAppleArchs
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archVec)

{
  cmMakefile *pcVar1;
  bool bVar2;
  ulong uVar3;
  string *this_00;
  allocator<char> local_169;
  string local_168;
  string_view local_148;
  allocator<char> local_131;
  string local_130;
  string *local_110;
  string *local_108;
  string local_100;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  undefined1 local_80 [8];
  string defVarName;
  cmValue archs;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *archVec_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  pcVar1 = this->Makefile;
  local_20 = archVec;
  archVec_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)config;
  config_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"APPLE",&local_41);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    cmValue::cmValue((cmValue *)((long)&defVarName.field_2 + 8),(nullptr_t)0x0);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_b0,"OSX_ARCHITECTURES_");
      cmsys::SystemTools::UpperCase(&local_100,(string *)archVec_local);
      cmAlphaNum::cmAlphaNum(&local_e0,&local_100);
      cmStrCat<>((string *)local_80,&local_b0,&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      local_108 = (string *)GetProperty(this,(string *)local_80);
      defVarName.field_2._8_8_ = local_108;
      std::__cxx11::string::~string((string *)local_80);
    }
    bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&defVarName.field_2 + 8));
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"OSX_ARCHITECTURES",&local_131);
      local_110 = (string *)GetProperty(this,&local_130);
      defVarName.field_2._8_8_ = local_110;
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&defVarName.field_2 + 8));
    if (bVar2) {
      this_00 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&defVarName.field_2 + 8));
      local_148 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      cmExpandList(local_148,local_20,false);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_20);
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"_CMAKE_APPLE_ARCHS_DEFAULT",&local_169);
      cmMakefile::GetDefExpandList(pcVar1,&local_168,local_20,false);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAppleArchs(const std::string& config,
                                      std::vector<std::string>& archVec) const
{
  if (!this->Makefile->IsOn("APPLE")) {
    return;
  }
  cmValue archs = nullptr;
  if (!config.empty()) {
    std::string defVarName =
      cmStrCat("OSX_ARCHITECTURES_", cmSystemTools::UpperCase(config));
    archs = this->GetProperty(defVarName);
  }
  if (!archs) {
    archs = this->GetProperty("OSX_ARCHITECTURES");
  }
  if (archs) {
    cmExpandList(*archs, archVec);
  }
  if (archVec.empty()) {
    this->Makefile->GetDefExpandList("_CMAKE_APPLE_ARCHS_DEFAULT", archVec);
  }
}